

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O2

c_v256 * c_v256_shl_16(c_v256 *__return_storage_ptr__,c_v256 a,uint c)

{
  c_v128 cVar1;
  c_v128 cVar2;
  
  cVar1 = c_v128_shl_16(a.v128[1],c);
  cVar2 = c_v128_shl_16(a.v128[0],c);
  __return_storage_ptr__->v128[1] = cVar1;
  __return_storage_ptr__->v128[0] = cVar2;
  return __return_storage_ptr__;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shl_16(c_v256 a, unsigned int c) {
  return c_v256_from_v128(c_v128_shl_16(a.v128[1], c),
                          c_v128_shl_16(a.v128[0], c));
}